

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::UniformCase::renderTest
          (UniformCase *this,
          vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,ShaderProgram *program,Random *rnd)

{
  CallLogWrapper *this_00;
  ostringstream *poVar1;
  pointer pBVar2;
  RenderContext *context;
  UniformCase *pUVar3;
  TestLog *pTVar4;
  GLenum GVar5;
  RenderTarget *pRVar6;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var7
  ;
  long lVar8;
  Texture2D *this_01;
  TextureCube *this_02;
  Surface *surface;
  VarValue *value;
  VarValue *value_00;
  void *__buf;
  int face;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *pvVar15;
  long lVar16;
  allocator<char> local_26a;
  allocator<char> local_269;
  UniformCase *local_268;
  VarValue *local_260;
  vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
  *local_258;
  Texture2D *texture;
  IndexType local_248;
  deUint16 *local_240;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_218;
  TestLog *local_210;
  long local_208;
  string local_200;
  Surface renderedImg;
  Vec4 color;
  
  local_210 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_258 = basicUniforms;
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar10 = pRVar6->m_width;
  local_228 = 0x20;
  if (iVar10 < 0x20) {
    local_228 = iVar10;
  }
  iVar9 = pRVar6->m_height;
  if (0x1f < pRVar6->m_height) {
    iVar9 = 0x20;
  }
  local_21c = de::Random::getInt(rnd,0,iVar10 - local_228);
  local_220 = de::Random::getInt(rnd,0,pRVar6->m_height - iVar9);
  local_224 = iVar9;
  tcu::Surface::Surface(&renderedImg,local_228,iVar9);
  local_218 = &this->m_filledTextureUnits;
  poVar1 = (ostringstream *)(color.m_data + 2);
  this_00 = &this->super_CallLogWrapper;
  local_208 = 0x30;
  local_268 = this;
  for (lVar16 = 0; iVar9 = local_21c, iVar10 = local_220, pUVar3 = local_268,
      pBVar2 = (local_258->
               super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
               )._M_impl.super__Vector_impl_data._M_start,
      lVar16 < (int)(((long)(local_258->
                            super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar2) / 0x98);
      lVar16 = lVar16 + 1) {
    if ((pBVar2[lVar16].type - TYPE_SAMPLER_1D < 0x1e) &&
       (_Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          ((local_268->m_filledTextureUnits).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (local_268->m_filledTextureUnits).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&pBVar2[lVar16].finalValue.val),
       _Var7._M_current ==
       (pUVar3->m_filledTextureUnits).
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish)) {
      color.m_data._0_8_ = local_210;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"// Filling texture at unit ");
      apiVarValueStr_abi_cxx11_
                ((string *)&texture,
                 (Functional *)
                 &(local_258->
                  super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                  )._M_impl.super__Vector_impl_data._M_start[lVar16].finalValue,value);
      std::operator<<((ostream *)poVar1,(string *)&texture);
      std::operator<<((ostream *)poVar1," with color ");
      shaderVarValueStr_abi_cxx11_
                (&local_200,
                 (Functional *)
                 &(local_258->
                  super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                  )._M_impl.super__Vector_impl_data._M_start[lVar16].finalValue,value_00);
      std::operator<<((ostream *)poVar1,(string *)&local_200);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&color,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&texture);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      pBVar2 = (local_258->
               super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_260 = &pBVar2[lVar16].finalValue;
      (local_268->super_CallLogWrapper).m_enableLog = false;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&color);
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        color.m_data[lVar8] =
             *(float *)((long)&(pBVar2->name)._M_dataplus._M_p + lVar8 * 4 + local_208);
      }
      if (local_260->type == TYPE_SAMPLER_CUBE) {
        this_02 = (TextureCube *)operator_new(0x180);
        glu::TextureCube::TextureCube
                  (this_02,((local_268->super_TestCase).m_context)->m_renderCtx,0x1908,0x1401,0x20);
        texture = (Texture2D *)this_02;
        std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::push_back
                  (&this->m_texturesCube,(value_type *)&texture);
        pvVar15 = (this_02->m_refTexture).m_access;
        for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
          tcu::TextureCube::allocLevel(&this_02->m_refTexture,(CubeFace)lVar8,0);
          fillWithColor((pvVar15->
                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                        )._M_impl.super__Vector_impl_data._M_start,&color);
          pvVar15 = pvVar15 + 1;
        }
        glu::CallLogWrapper::glActiveTexture(this_00,(local_260->val).intV[0] + 0x84c0);
        GVar5 = glu::CallLogWrapper::glGetError(this_00);
        glu::checkError(GVar5,"glActiveTexture(GL_TEXTURE0 + value.val.samplerV.unit)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                        ,0x4ea);
        local_200._M_dataplus._M_p._0_4_ = (local_260->val).floatV[0];
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (local_218,(uint *)&local_200);
        glu::TextureCube::upload((TextureCube *)texture);
        glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x2802,0x812f);
        GVar5 = glu::CallLogWrapper::glGetError(this_00);
        glu::checkError(GVar5,
                        "glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                        ,0x4ed);
        glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x2803,0x812f);
        GVar5 = glu::CallLogWrapper::glGetError(this_00);
        glu::checkError(GVar5,
                        "glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                        ,0x4ee);
        glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x2801,0x2600);
        GVar5 = glu::CallLogWrapper::glGetError(this_00);
        glu::checkError(GVar5,
                        "glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_NEAREST)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                        ,0x4ef);
        glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x2800,0x2600);
        GVar5 = glu::CallLogWrapper::glGetError(this_00);
        glu::checkError(GVar5,
                        "glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_NEAREST)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                        ,0x4f0);
      }
      else if (local_260->type == TYPE_SAMPLER_2D) {
        this_01 = (Texture2D *)operator_new(0x70);
        glu::Texture2D::Texture2D
                  (this_01,((local_268->super_TestCase).m_context)->m_renderCtx,0x1908,0x1401,0x20,
                   0x20);
        texture = this_01;
        std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::push_back
                  (&this->m_textures2d,&texture);
        tcu::Texture2D::allocLevel(&this_01->m_refTexture,0);
        fillWithColor((this_01->m_refTexture).super_TextureLevelPyramid.m_access.
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start,&color);
        glu::CallLogWrapper::glActiveTexture(this_00,(local_260->val).intV[0] + 0x84c0);
        GVar5 = glu::CallLogWrapper::glGetError(this_00);
        glu::checkError(GVar5,"glActiveTexture(GL_TEXTURE0 + value.val.samplerV.unit)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                        ,0x4d5);
        local_200._M_dataplus._M_p._0_4_ = (local_260->val).floatV[0];
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (local_218,(uint *)&local_200);
        (*texture->_vptr_Texture2D[2])();
        glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2802,0x812f);
        GVar5 = glu::CallLogWrapper::glGetError(this_00);
        glu::checkError(GVar5,"glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                        ,0x4d8);
        glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2803,0x812f);
        GVar5 = glu::CallLogWrapper::glGetError(this_00);
        glu::checkError(GVar5,"glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                        ,0x4d9);
        glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
        GVar5 = glu::CallLogWrapper::glGetError(this_00);
        glu::checkError(GVar5,"glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                        ,0x4da);
        glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
        GVar5 = glu::CallLogWrapper::glGetError(this_00);
        glu::checkError(GVar5,"glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                        ,0x4db);
      }
      (local_268->super_CallLogWrapper).m_enableLog = true;
    }
    local_208 = local_208 + 0x98;
  }
  glu::CallLogWrapper::glViewport(this_00,local_21c,local_220,local_228,local_224);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"glViewport(viewportX, viewportY, viewportW, viewportH)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                  ,0x64a);
  glu::CallLogWrapper::glClearColor(this_00,0.0,0.0,0.0,1.0);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"glClearColor(0.0f, 0.0f, 0.0f, 1.0f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                  ,0x64b);
  glu::CallLogWrapper::glClear(this_00,0x4000);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"glClear(GL_COLOR_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                  ,0x64c);
  glu::CallLogWrapper::glUseProgram(this_00,(program->m_program).m_program);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"glUseProgram(program.getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                  ,0x64d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&texture,"a_position",(allocator<char> *)&local_200);
  pTVar4 = local_210;
  pUVar3 = local_268;
  glu::va::Float((VertexArrayBinding *)&color,(string *)&texture,4,4,0,renderTest::position);
  std::__cxx11::string::~string((string *)&texture);
  texture = (Texture2D *)0x600000000;
  local_248 = INDEXTYPE_UINT16;
  local_240 = renderTest::indices;
  glu::draw(((pUVar3->super_TestCase).m_context)->m_renderCtx,(program->m_program).m_program,1,
            (VertexArrayBinding *)&color,(PrimitiveList *)&texture,(DrawUtilCallback *)0x0);
  context = ((pUVar3->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&texture,&renderedImg);
  glu::readPixels(context,iVar9,iVar10,(PixelBufferAccess *)&texture);
  std::__cxx11::string::~string((string *)(color.m_data + 2));
  iVar10 = 0;
  uVar11 = 0;
  if (0 < renderedImg.m_width) {
    uVar11 = (ulong)(uint)renderedImg.m_width;
  }
  if (renderedImg.m_height < 1) {
    renderedImg.m_height = 0;
  }
  iVar9 = 0;
  for (iVar12 = 0; uVar14 = uVar11, iVar13 = iVar10, iVar12 != renderedImg.m_height;
      iVar12 = iVar12 + 1) {
    while (uVar14 != 0) {
      iVar9 = iVar9 + (uint)(*(int *)((long)renderedImg.m_pixels.m_ptr + (long)iVar13 * 4) !=
                            -0xff0100);
      uVar14 = uVar14 - 1;
      iVar13 = iVar13 + 1;
    }
    iVar10 = iVar10 + renderedImg.m_width;
  }
  if (iVar9 < 1) {
    color.m_data._0_8_ = pTVar4;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(color.m_data + 2));
    std::operator<<((ostream *)(color.m_data + 2),
                    "Success: got all-green pixels (all uniforms have correct values)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&color,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&texture,"RenderedImage",&local_269);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,"Rendered image",&local_26a);
    surface = &renderedImg;
    tcu::LogImage::LogImage
              ((LogImage *)&color,(string *)&texture,&local_200,surface,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&color,(int)pTVar4,__buf,(size_t)surface);
    tcu::LogImage::~LogImage((LogImage *)&color);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&texture);
    color.m_data._0_8_ = pTVar4;
    poVar1 = (ostringstream *)(color.m_data + 2);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"FAILURE: image comparison failed, got ");
    std::ostream::operator<<(poVar1,iVar9);
    std::operator<<((ostream *)poVar1," non-green pixels");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&color,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(color.m_data + 2));
  tcu::Surface::~Surface(&renderedImg);
  return iVar9 < 1;
}

Assistant:

bool UniformCase::renderTest (const vector<BasicUniform>& basicUniforms, const ShaderProgram& program, Random& rnd)
{
	TestLog&					log				= m_testCtx.getLog();
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderTarget();
	const int					viewportW		= de::min<int>(renderTarget.getWidth(),		MAX_RENDER_WIDTH);
	const int					viewportH		= de::min<int>(renderTarget.getHeight(),	MAX_RENDER_HEIGHT);
	const int					viewportX		= rnd.getInt(0, renderTarget.getWidth()		- viewportW);
	const int					viewportY		= rnd.getInt(0, renderTarget.getHeight()	- viewportH);
	tcu::Surface				renderedImg		(viewportW, viewportH);

	// Assert that no two samplers of different types have the same texture unit - this is an error in GL.
	for (int i = 0; i < (int)basicUniforms.size(); i++)
	{
		if (glu::isDataTypeSampler(basicUniforms[i].type))
		{
			for (int j = 0; j < i; j++)
			{
				if (glu::isDataTypeSampler(basicUniforms[j].type) && basicUniforms[i].type != basicUniforms[j].type)
					DE_ASSERT(basicUniforms[i].finalValue.val.samplerV.unit != basicUniforms[j].finalValue.val.samplerV.unit);
			}
		}
	}

	for (int i = 0; i < (int)basicUniforms.size(); i++)
	{
		if (glu::isDataTypeSampler(basicUniforms[i].type) && std::find(m_filledTextureUnits.begin(), m_filledTextureUnits.end(), basicUniforms[i].finalValue.val.samplerV.unit) == m_filledTextureUnits.end())
		{
			log << TestLog::Message << "// Filling texture at unit " << apiVarValueStr(basicUniforms[i].finalValue) << " with color " << shaderVarValueStr(basicUniforms[i].finalValue) << TestLog::EndMessage;
			setupTexture(basicUniforms[i].finalValue);
		}
	}

	GLU_CHECK_CALL(glViewport(viewportX, viewportY, viewportW, viewportH));
	GLU_CHECK_CALL(glClearColor(0.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT));
	GLU_CHECK_CALL(glUseProgram(program.getProgram()));

	{
		static const float position[] =
		{
			-1.0f, -1.0f, 0.0f, 1.0f,
			-1.0f, +1.0f, 0.0f, 1.0f,
			+1.0f, -1.0f, 0.0f, 1.0f,
			+1.0f, +1.0f, 0.0f, 1.0f
		};
		static const deUint16			indices[]	= { 0, 1, 2, 2, 1, 3 };
		const glu::VertexArrayBinding	binding		= glu::va::Float("a_position", 4, 4, 0, &position[0]);

		glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &binding, glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
		glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedImg.getAccess());
	}

	int numFailedPixels = 0;
	for (int y = 0; y < renderedImg.getHeight(); y++)
	{
		for (int x = 0; x < renderedImg.getWidth(); x++)
		{
			if (renderedImg.getPixel(x, y) != tcu::RGBA::green())
				numFailedPixels += 1;
		}
	}

	if (numFailedPixels > 0)
	{
		log << TestLog::Image("RenderedImage", "Rendered image", renderedImg);
		log << TestLog::Message << "FAILURE: image comparison failed, got " << numFailedPixels << " non-green pixels" << TestLog::EndMessage;
		return false;
	}
	else
	{
		log << TestLog::Message << "Success: got all-green pixels (all uniforms have correct values)" << TestLog::EndMessage;
		return true;
	}
}